

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sbox.cpp
# Opt level: O1

void __thiscall Sbox::~Sbox(Sbox *this)

{
  Sequence *pSVar1;
  _Map_pointer ppiVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  do {
    pSVar1 = this->m_tab[lVar4];
    if (pSVar1 != (Sequence *)0x0) {
      ppiVar2 = pSVar1[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (ppiVar2 != (_Map_pointer)0x0) {
        lVar3 = (long)ppiVar2 * 0x58;
        do {
          *(undefined ***)((long)&pSVar1[-1]._vptr_Sequence + lVar3) = &PTR_shift_00116d08;
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    ((_Deque_base<int,_std::allocator<int>_> *)((long)pSVar1 + lVar3 + -0x50));
          lVar3 = lVar3 + -0x58;
        } while (lVar3 != 0);
      }
      operator_delete__(&pSVar1[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node,(long)ppiVar2 * 0x58 + 8);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (this->m_tab != (Sequence **)0x0) {
    operator_delete__(this->m_tab);
    return;
  }
  return;
}

Assistant:

Sbox::~Sbox() {
    for (auto i = 0; i < 4; ++i) {
        delete[] m_tab[i];
    }
    delete[] m_tab;
}